

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O0

bool DecodeBase58Check(string *str,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchRet,
                      int max_ret)

{
  long lVar1;
  string_view str_00;
  bool bVar2;
  undefined4 in_EDX;
  undefined8 in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  int max_ret_len;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (undefined4)in_RSI;
  max_ret_len = (int)((ulong)in_RSI >> 0x20);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_EDX,in_stack_ffffffffffffffd8));
  str_00._M_len._4_4_ = max_ret_len;
  str_00._M_len._0_4_ = uVar3;
  str_00._M_str = (char *)in_RDI;
  bVar2 = util::ContainsNoNUL(str_00);
  if (bVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
              (in_stack_ffffffffffffffb8);
    bVar2 = DecodeBase58Check((char *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
                              in_RDI,max_ret_len);
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool DecodeBase58Check(const std::string& str, std::vector<unsigned char>& vchRet, int max_ret)
{
    if (!ContainsNoNUL(str)) {
        return false;
    }
    return DecodeBase58Check(str.c_str(), vchRet, max_ret);
}